

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  ushort uVar1;
  CType *pCVar2;
  CTSize CVar3;
  
  while( true ) {
    uVar1 = ct->sib;
    if (uVar1 == 0) {
      return (CType *)0x0;
    }
    pCVar2 = cts->tab;
    ct = pCVar2 + uVar1;
    if ((GCstr *)(ulong)pCVar2[uVar1].name.gcptr32 == name) break;
    if (((ct->info & 0xf0ff0000) == 0x80030000) &&
       (pCVar2 = lj_ctype_getfieldq(cts,(CType *)((long)&pCVar2->info +
                                                 (ulong)((ct->info & 0xffff) << 4)),name,ofs,qual),
       pCVar2 != (CType *)0x0)) {
      if (qual != (CTInfo *)0x0) {
        *qual = *qual;
      }
      CVar3 = *ofs + ct->size;
      ct = pCVar2;
LAB_00155605:
      *ofs = CVar3;
      return ct;
    }
  }
  CVar3 = ct->size;
  goto LAB_00155605;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}